

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O0

QSize QtMWidgets::qSmartMaxSize
                (QSize *sizeHint,QSize *minSize,QSize *maxSize,QSizePolicy *sizePolicy,
                Alignment align)

{
  Int IVar1;
  int iVar2;
  Policy PVar3;
  bool bVar4;
  bool local_5b;
  bool local_5a;
  Int local_58;
  Int local_54;
  QFlags<Qt::AlignmentFlag> local_50;
  QFlags<Qt::AlignmentFlag> local_4c;
  QSize local_48;
  QSize hint;
  QSizePolicy *sizePolicy_local;
  QSize *maxSize_local;
  QSize *minSize_local;
  QSize *sizeHint_local;
  QSize QStack_10;
  Alignment align_local;
  QSize s;
  
  sizeHint_local._4_4_ = align.i;
  hint.ht = (int)QFlags<Qt::AlignmentFlag>::operator&
                           ((QFlags<Qt::AlignmentFlag> *)((long)&sizeHint_local + 4),
                            AlignHorizontal_Mask);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&hint.ht);
  bVar4 = false;
  if (IVar1 != 0) {
    hint.wd = (int)QFlags<Qt::AlignmentFlag>::operator&
                             ((QFlags<Qt::AlignmentFlag> *)((long)&sizeHint_local + 4),
                              AlignVertical_Mask);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&hint);
    bVar4 = IVar1 != 0;
  }
  if (bVar4) {
    QSize::QSize(&stack0xfffffffffffffff0,0x7ffff,0x7ffff);
  }
  else {
    QStack_10 = *maxSize;
    local_48 = QSize::expandedTo(sizeHint,minSize);
    iVar2 = QSize::width(&stack0xfffffffffffffff0);
    local_5a = false;
    if (iVar2 == 0xffffff) {
      local_4c = QFlags<Qt::AlignmentFlag>::operator&
                           ((QFlags<Qt::AlignmentFlag> *)((long)&sizeHint_local + 4),
                            AlignHorizontal_Mask);
      local_5a = QFlags<Qt::AlignmentFlag>::operator!(&local_4c);
    }
    if ((local_5a != false) &&
       (PVar3 = QSizePolicy::horizontalPolicy(sizePolicy), (PVar3 & Minimum) == Fixed)) {
      iVar2 = QSize::width(&local_48);
      QSize::setWidth(&stack0xfffffffffffffff0,iVar2);
    }
    iVar2 = QSize::height(&stack0xfffffffffffffff0);
    local_5b = false;
    if (iVar2 == 0xffffff) {
      local_50 = QFlags<Qt::AlignmentFlag>::operator&
                           ((QFlags<Qt::AlignmentFlag> *)((long)&sizeHint_local + 4),
                            AlignVertical_Mask);
      local_5b = QFlags<Qt::AlignmentFlag>::operator!(&local_50);
    }
    if ((local_5b != false) &&
       (PVar3 = QSizePolicy::verticalPolicy(sizePolicy), (PVar3 & Minimum) == Fixed)) {
      iVar2 = QSize::height(&local_48);
      QSize::setHeight(&stack0xfffffffffffffff0,iVar2);
    }
    local_54 = (Int)QFlags<Qt::AlignmentFlag>::operator&
                              ((QFlags<Qt::AlignmentFlag> *)((long)&sizeHint_local + 4),
                               AlignHorizontal_Mask);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_54);
    if (IVar1 != 0) {
      QSize::setWidth(&stack0xfffffffffffffff0,0x7ffff);
    }
    local_58 = (Int)QFlags<Qt::AlignmentFlag>::operator&
                              ((QFlags<Qt::AlignmentFlag> *)((long)&sizeHint_local + 4),
                               AlignVertical_Mask);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_58);
    if (IVar1 != 0) {
      QSize::setHeight(&stack0xfffffffffffffff0,0x7ffff);
    }
  }
  return QStack_10;
}

Assistant:

QSize qSmartMaxSize( const QSize & sizeHint,
	const QSize & minSize, const QSize & maxSize,
	const QSizePolicy & sizePolicy, Qt::Alignment align )
{
	if( align & Qt::AlignHorizontal_Mask && align & Qt::AlignVertical_Mask )
		return QSize( QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX );

	QSize s = maxSize;
	QSize hint = sizeHint.expandedTo( minSize );

	if( s.width() == QWIDGETSIZE_MAX && !( align & Qt::AlignHorizontal_Mask ) )
		if( !( sizePolicy.horizontalPolicy() & QSizePolicy::GrowFlag ) )
			s.setWidth( hint.width() );

	if( s.height() == QWIDGETSIZE_MAX && !( align & Qt::AlignVertical_Mask ) )
		if( !( sizePolicy.verticalPolicy() & QSizePolicy::GrowFlag ) )
			s.setHeight( hint.height() );

	if( align & Qt::AlignHorizontal_Mask )
		s.setWidth( QLAYOUTSIZE_MAX );

	if( align & Qt::AlignVertical_Mask )
		s.setHeight( QLAYOUTSIZE_MAX );

	return s;
}